

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

void legendre_associated_normalized(int n,int m,double x,double *cx)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  
  if (m < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of M is ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,m);
    std::operator<<(poVar4,"\n");
    pcVar7 = "  but M must be nonnegative.\n";
  }
  else if (n < m) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of M = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,m);
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of N = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,n);
    std::operator<<(poVar4,"\n");
    pcVar7 = "  but M must be less than or equal to N.\n";
  }
  else if (x < -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,x);
    std::operator<<(poVar4,"\n");
    pcVar7 = "  but X must be no less than -1.\n";
  }
  else {
    if (x <= 1.0) {
      uVar8 = (ulong)(uint)m;
      for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
        cx[uVar3] = 0.0;
      }
      cx[uVar8] = 1.0;
      dVar11 = 1.0 - x * x;
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      dVar12 = 1.0;
      iVar2 = m;
      while (bVar10 = iVar2 != 0, iVar2 = iVar2 + -1, bVar10) {
        cx[uVar8] = -cx[uVar8] * dVar12 * dVar11;
        dVar12 = dVar12 + 2.0;
      }
      if (m < n) {
        cx[uVar8 + 1] = (double)(m * 2 + 1) * x * cx[uVar8];
      }
      uVar1 = m * 2;
      uVar5 = ~uVar1;
      iVar2 = m * 2 + 3;
      iVar6 = 2;
      for (uVar3 = (ulong)(m + 2); (int)uVar3 <= n; uVar3 = uVar3 + 1) {
        cx[uVar3] = ((double)iVar2 * x * cx[uVar3 - 1] + (double)(int)uVar5 * cx[uVar3 - 2]) /
                    (double)iVar6;
        uVar5 = uVar5 - 1;
        iVar2 = iVar2 + 2;
        iVar6 = iVar6 + 1;
      }
      iVar2 = 0;
      for (lVar9 = 0; iVar6 = (int)lVar9, m + iVar6 <= n; lVar9 = lVar9 + 1) {
        dVar11 = r8_factorial(iVar6);
        dVar12 = r8_factorial(uVar1 + iVar6);
        dVar11 = (dVar11 * (double)(int)(iVar2 + 1 + uVar1)) / (dVar12 * 12.566370614359172);
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        cx[uVar8 + lVar9] = dVar11 * cx[uVar8 + lVar9];
        iVar2 = iVar2 + 2;
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,x);
    std::operator<<(poVar4,"\n");
    pcVar7 = "  but X must be no more than 1.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void legendre_associated_normalized ( int n, int m, double x, double cx[] )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_ASSOCIATED_NORMALIZED: normalized associated Legendre functions.
//
//  Discussion:
//
//    The unnormalized associated Legendre functions P_N^M(X) have
//    the property that
//
//      Integral ( -1 <= X <= 1 ) ( P_N^M(X) )^2 dX
//      = 2 * ( N + M )! / ( ( 2 * N + 1 ) * ( N - M )! )
//
//    By dividing the function by the square root of this term,
//    the normalized associated Legendre functions have norm 1.
//
//    However, we plan to use these functions to build spherical
//    harmonics, so we use a slightly different normalization factor of
//
//      sqrt ( ( ( 2 * N + 1 ) * ( N - M )! ) / ( 4 * pi * ( N + M )! ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the maximum first index of the Legendre
//    function, which must be at least 0.
//
//    Input, int M, the second index of the Legendre function,
//    which must be at least 0, and no greater than N.
//
//    Input, double X, the point at which the function is to be
//    evaluated.  X must satisfy -1 <= X <= 1.
//
//    Output, double CX[N+1], the values of the first N+1 function.
//
{
  double factor;
  int i;
  int mm;
  const double r8_pi = 3.141592653589793;
  double somx2;

  if ( m < 0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of M is " << m << "\n";
    std::cerr << "  but M must be nonnegative.\n";
    exit ( 1 );
  }

  if ( n < m )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of M = " << m << "\n";
    std::cerr << "  Input value of N = " << n << "\n";
    std::cerr << "  but M must be less than or equal to N.\n";
    exit ( 1 );
  }

  if ( x < -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no less than -1.\n";
    exit ( 1 );
  }

  if ( 1.0 < x )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no more than 1.\n";
    exit ( 1 );
  }

  for ( i = 0; i <= m-1; i++ )
  {
    cx[i] = 0.0;
  }
  cx[m] = 1.0;

  somx2 = sqrt ( 1.0 - x * x );

  factor = 1.0;
  for ( i = 1; i <= m; i++ )
  {
    cx[m] = -cx[m] * factor * somx2;
    factor = factor + 2.0;
  }

  if ( m+1 <= n )
  {
    cx[m+1] = x * double( 2 * m + 1 ) * cx[m];
  }

  for ( i = m+2; i <= n; i++ )
  {
    cx[i] = ( double( 2 * i     - 1 ) * x * cx[i-1] 
            + double(   - i - m + 1 )     * cx[i-2] ) 
            / double(     i - m     );
  }
//
//  Normalization.
//
  for ( mm = m; mm <= n; mm++ )
  {
    factor = sqrt ( ( double( 2 * mm + 1 ) * r8_factorial ( mm - m ) ) 
      / ( 4.0 * r8_pi * r8_factorial ( mm + m ) ) );
    cx[mm] = cx[mm] * factor;
  }

  return;
}